

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O2

void __thiscall Fluid::grid_to_particle(Fluid *this)

{
  PFNGLUNIFORM1FPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORM3IVPROC p_Var3;
  GLint GVar4;
  allocator<char> local_a9;
  GLchar *local_a8 [4];
  GLchar *local_88 [4];
  GLchar *local_68 [4];
  GLchar *local_48 [4];
  
  (*glad_glMemoryBarrier)(0xffffffff);
  gfx::Program::use(&this->grid_to_particle_program);
  p_Var2 = glad_glUniform3fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"bounds_min",&local_a9);
  GVar4 = (*glad_glGetUniformLocation)((this->grid_to_particle_program).id,local_48[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&this->bounds_min);
  std::__cxx11::string::~string((string *)local_48);
  p_Var2 = glad_glUniform3fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"bounds_max",&local_a9);
  GVar4 = (*glad_glGetUniformLocation)((this->grid_to_particle_program).id,local_68[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&this->bounds_max);
  std::__cxx11::string::~string((string *)local_68);
  p_Var3 = glad_glUniform3iv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"grid_dim",&local_a9);
  GVar4 = (*glad_glGetUniformLocation)((this->grid_to_particle_program).id,local_88[0]);
  (*p_Var3)(GVar4,1,(GLint *)&this->grid_dimensions);
  std::__cxx11::string::~string((string *)local_88);
  p_Var1 = glad_glUniform1f;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"pic_flip_blend",&local_a9);
  GVar4 = (*glad_glGetUniformLocation)((this->grid_to_particle_program).id,local_a8[0]);
  (*p_Var1)(GVar4,this->pic_flip_blend);
  std::__cxx11::string::~string((string *)local_a8);
  gfx::Program::validate(&this->grid_to_particle_program);
  (*glad_glDispatchCompute)((this->particle_ssbo)._length,1,1);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void grid_to_particle() {
        ssbo_barrier();
        grid_to_particle_program.use();
        glUniform3fv(grid_to_particle_program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(grid_to_particle_program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(grid_to_particle_program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        glUniform1f(grid_to_particle_program.uniform_loc("pic_flip_blend"), pic_flip_blend);
        grid_to_particle_program.validate();
        glDispatchCompute(particle_ssbo.length(), 1, 1);
        grid_to_particle_program.disuse();
    }